

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[46],unsigned_int,char[2],unsigned_int,char>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [46],uint *Args_1,
          char (*Args_2) [2],uint *Args_3,char *Args_4)

{
  stringstream local_1c0 [8];
  stringstream ss;
  char *Args_local_4;
  uint *Args_local_3;
  char (*Args_local_2) [2];
  uint *Args_local_1;
  char (*Args_local) [46];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[46],unsigned_int,char[2],unsigned_int,char>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [46])this,(uint *)Args,(char (*) [2])Args_1,(uint *)Args_2,(char *)Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}